

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void rw::correctPathCase(char *filename)

{
  int iVar1;
  char *s2;
  DIR *__dirp;
  dirent *pdVar2;
  char local_838 [8];
  char sofar [1024];
  char copy [1024];
  char *local_30;
  char *arg;
  char *dir;
  dirent *dirent;
  DIR *direct;
  char *filename_local;
  
  memset(local_838,0,0x400);
  local_838[0] = '.';
  strncpy(sofar + 0x3f8,filename,0x400);
  local_30 = sofar + 0x3f8;
  if (*filename == '/') {
    local_838[0] = '/';
    local_838[1] = 0x2f;
    local_838[2] = 0;
    local_30 = sofar + 0x3f9;
  }
  do {
    s2 = strtok(local_30,"/");
    if (s2 == (char *)0x0) {
      strcpy(filename,local_838 + 2);
      return;
    }
    local_30 = (char *)0x0;
    __dirp = opendir(local_838);
    if (s2 == (char *)0x0) {
      return;
    }
    do {
      pdVar2 = readdir(__dirp);
      if (pdVar2 == (dirent *)0x0) goto LAB_00106b30;
      iVar1 = strncmp_ci(pdVar2->d_name,s2,0x400);
    } while (iVar1 != 0);
    strncat(local_838,"/",0x400);
    strncat(local_838,pdVar2->d_name,0x400);
LAB_00106b30:
    closedir(__dirp);
    if (pdVar2 == (dirent *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void
correctPathCase(char *filename)
{
#ifdef __unix__
	DIR *direct;
	struct dirent *dirent;

	char *dir, *arg;
	char copy[1024], sofar[1024] = ".";
	strncpy(copy, filename, 1024);
	arg = copy;
	// hack for absolute paths
	if(filename[0] == '/'){
		sofar[0] = '/';
		sofar[1] = '/';
		sofar[2] = '\0';
		arg++;
	}
	while((dir = strtok(arg, PSEP_S))){
		arg = nil;
		if(direct = opendir(sofar), dir == nil)
			return;
		while(dirent = readdir(direct), dirent != nil)
			if(strncmp_ci(dirent->d_name, dir, 1024) == 0){
				strncat(sofar, PSEP_S, 1024);
				strncat(sofar, dirent->d_name, 1024);
				break;
			}
		closedir(direct);
		if(dirent == nil)
			return;
	}
	strcpy(filename, sofar+2);
#endif
}